

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

ostream * Logger::Start(LogSeverity severity,string *file,int line,string *function)

{
  ostream *poVar1;
  size_t sVar2;
  time_t tm;
  char time_string [128];
  time_t local_c0;
  char local_b8 [136];
  
  time(&local_c0);
  ctime_r(&local_c0,local_b8);
  poVar1 = GetStream(severity);
  sVar2 = strlen(local_b8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_b8,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(file->_M_dataplus)._M_p,file->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(function->_M_dataplus)._M_p,function->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
  poVar1 = (ostream *)std::ostream::flush();
  return poVar1;
}

Assistant:

std::ostream& Logger::Start(LogSeverity severity,
                            const std::string& file,
                            int line,
                            const std::string& function) {
  time_t tm;
  time(&tm);
  char time_string[128];
#ifndef _MSC_VER
  ctime_r(&tm, time_string);
#else
  ctime_s(time_string, sizeof(time_string), &tm);
#endif
  return GetStream(severity) << time_string
                             << " " << file << ":" << line
                             << " (" << function << ") " << std::flush;
}